

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>_>
* __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::Clone
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>_>
  *pPVar2;
  
  pPVar2 = (ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>_>
            *)operator_new(0x80);
  pPVar2->_vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_010591d0;
  pPVar2[1]._vptr_ParamIteratorInterface = (_func_int **)this->base_;
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  ::tuple((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
           *)(pPVar2 + 2),&this->begin_);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  ::tuple((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
           *)(pPVar2 + 6),&this->end_);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  ::tuple((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
           *)(pPVar2 + 10),&this->current_);
  pPVar2[0xe]._vptr_ParamIteratorInterface =
       (_func_int **)
       (this->current_value_).
       super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  p_Var1 = (this->current_value_).
           super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  pPVar2[0xf]._vptr_ParamIteratorInterface = (_func_int **)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return pPVar2;
}

Assistant:

ParamIteratorInterface<ParamType>* Clone() const override {
      return new IteratorImpl(*this);
    }